

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  int *piVar2;
  size_type sVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  nonempty_iterator piVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int i;
  iterator *piVar12;
  AssertHelper *pAVar13;
  undefined8 *puVar14;
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar15;
  pointer piVar16;
  char *in_R9;
  byte bVar17;
  AssertionResult gtest_ar;
  iterator it;
  iterator in_stack_fffffffffffffe48;
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_168;
  undefined1 local_120 [16];
  undefined1 local_110 [40];
  iterator local_e8;
  nonempty_iterator local_e0;
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_d8;
  iterator local_d0;
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_88;
  AssertHelper local_80;
  AssertHelper local_78 [9];
  
  bVar17 = 0;
  iVar9 = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.
                   super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> + 0x2a) =
       true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar9;
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_168.ht._4_4_ << 0x20);
  local_78[0].data_._0_4_ = UniqueObjectHelper<int>(0x14);
  local_78[0].data_._0_4_ = -(int)local_78[0].data_;
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)google::
                   sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::erase(this_00,(key_type *)local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"0u","this->ht_.erase(this->UniqueKey(20))",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x403,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  iVar9 = UniqueObjectHelper<int>(10);
  local_d0.ht._0_4_ = iVar9;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_120,this_00,(const_reference)&local_d0);
  iVar9 = UniqueObjectHelper<int>(0x14);
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)CONCAT44(local_d0.ht._4_4_,iVar9);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_120,this_00,(const_reference)&local_d0);
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_168.ht._4_4_,1);
  local_78[0].data_._0_4_ = UniqueObjectHelper<int>(0x14);
  local_78[0].data_._0_4_ = -(int)local_78[0].data_;
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)google::
                   sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::erase(this_00,(key_type *)local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"1u","this->ht_.erase(this->UniqueKey(20))",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x406,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_168.ht._4_4_,1);
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)(*(size_type *)
                     ((long)&(this->
                             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             ).
                             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             .ht_.
                             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             .ht_.table.settings + 0x18) -
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"1u","this->ht_.size()",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x407,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_168.ht & 0xffffffff00000000);
  local_78[0].data_._0_4_ = UniqueObjectHelper<int>(0x14);
  local_78[0].data_._0_4_ = -(int)local_78[0].data_;
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)google::
                   sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::erase(this_00,(key_type *)local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"0u","this->ht_.erase(this->UniqueKey(20))",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x408,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_168.ht._4_4_,1);
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)(*(size_type *)
                     ((long)&(this->
                             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             ).
                             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             .ht_.
                             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             .ht_.table.settings + 0x18) -
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"1u","this->ht_.size()",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x409,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_168.ht & 0xffffffff00000000);
  local_78[0].data_._0_4_ = UniqueObjectHelper<int>(0x13);
  local_78[0].data_._0_4_ = -(int)local_78[0].data_;
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)google::
                   sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::erase(this_00,(key_type *)local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"0u","this->ht_.erase(this->UniqueKey(19))",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x40a,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_168.ht._4_4_,1);
  local_d0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)(*(size_type *)
                     ((long)&(this->
                             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             ).
                             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             .ht_.
                             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             .ht_.table.settings + 0x18) -
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"1u","this->ht_.size()",(uint *)&local_168,
             (unsigned_long *)&local_d0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_ ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x40b,(char *)piVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_d0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  pHVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  if ((sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_120._8_8_ !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)local_120._8_8_);
  }
  iVar9 = UniqueObjectHelper<int>(10);
  local_120._0_4_ = -iVar9;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_d0,this_00,(int *)local_120);
  local_120._8_8_ =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.table.groups + 0x10))->_M_start;
  local_110._0_8_ =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.groups + 0x18);
  local_110._16_8_ = (pointer)0x0;
  local_e0 = (nonempty_iterator)0x0;
  local_120._0_8_ = this_00;
  local_110._8_8_ = local_110._0_8_;
  local_110._24_8_ = local_120._8_8_;
  local_110._32_8_ = local_110._0_8_;
  local_e8._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_110._0_8_;
  local_88 = pHVar1;
  google::
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_120);
  if (((local_d0.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        local_120._8_8_) &&
      (local_d0.pos.row_end._M_current ==
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_110._0_8_)) &&
     (local_d0.pos.row_current._M_current ==
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      local_110._8_8_)) {
    if (local_110._8_8_ == local_110._0_8_) {
      local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)((ulong)local_168.ht._1_7_ << 8);
    }
    else {
      local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_168.ht._1_7_,
                                 local_d0.pos.col_current != (nonempty_iterator)local_110._16_8_);
      local_168.pos.row_begin._M_current =
           (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)0x0;
      if (local_d0.pos.col_current != (nonempty_iterator)local_110._16_8_) goto LAB_00901507;
    }
    local_168.pos.row_begin._M_current =
         (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *
         )0x0;
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_120,(internal *)&local_168,(AssertionResult *)"it != this->ht_.end()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x40e,(char *)local_120._0_8_);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_120._0_8_ !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_110) {
      operator_delete((void *)local_120._0_8_);
    }
    if ((long *)CONCAT44(local_78[0].data_._4_4_,(int)local_78[0].data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78[0].data_._4_4_,(int)local_78[0].data_) + 8))();
    }
    iVar4._M_current = local_168.pos.row_begin._M_current;
    if (local_168.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      if ((int **)(local_168.pos.row_begin._M_current)->group !=
          &((local_168.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_168.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar4._M_current);
    }
  }
LAB_00901507:
  piVar12 = &local_d0;
  puVar14 = (undefined8 *)&stack0xfffffffffffffe48;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar14 = piVar12->ht;
    piVar12 = (iterator *)((long)piVar12 + ((ulong)bVar17 * -2 + 1) * 8);
    puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
  }
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_00,in_stack_fffffffffffffe48);
  local_78[0].data_._0_4_ = 0;
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(*(size_type *)
                      ((long)&(this->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.table.settings + 0x18) -
                    (this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"0u","this->ht_.size()",(uint *)local_78,
             (unsigned_long *)&local_168);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((pointer)local_120._8_8_ == (pointer)0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x410,(char *)piVar16);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_168.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_168.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((pointer)local_120._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  iVar9 = 10;
  do {
    iVar10 = UniqueObjectHelper<int>(iVar9);
    local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)CONCAT44(local_168.ht._4_4_,iVar10);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(this_00,1);
    google::
    sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_120,this_00,(const_reference)&local_168);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 100);
  local_78[0].data_._0_4_ = 0x5a;
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(*(size_type *)
                      ((long)&(this->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.table.settings + 0x18) -
                    (this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"90u","this->ht_.size()",(uint *)local_78,
             (unsigned_long *)&local_168);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((pointer)local_120._8_8_ == (pointer)0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x413,(char *)piVar16);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_168.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_168.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((pointer)local_120._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin((iterator *)local_120,this_00);
  local_d8 = pHVar1;
  piVar12 = (iterator *)local_120;
  pAVar13 = local_78;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    pAVar13->data_ = (AssertHelperData *)piVar12->ht;
    piVar12 = (iterator *)((long)piVar12 + (ulong)bVar17 * -0x10 + 8);
    pAVar13 = pAVar13 + (ulong)bVar17 * -2 + 1;
  }
  local_168.pos.row_begin._M_current =
       ((_Vector_impl_data *)
       ((long)&(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.table.groups + 0x10))->_M_start;
  local_168.pos.row_end._M_current =
       *(pointer *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.groups + 0x18);
  local_168.pos.col_current = (int *)0x0;
  local_168.end.col_current = (nonempty_iterator)0x0;
  local_168.ht = this_00;
  local_168.pos.row_current._M_current = local_168.pos.row_end._M_current;
  local_168.end.row_begin._M_current = local_168.pos.row_begin._M_current;
  local_168.end.row_end._M_current = local_168.pos.row_end._M_current;
  local_168.end.row_current._M_current = local_168.pos.row_end._M_current;
  google::
  sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_168);
  piVar7 = local_168.pos.col_current;
  iVar6._M_current = local_168.pos.row_current._M_current;
  iVar5._M_current = local_168.pos.row_end._M_current;
  iVar4._M_current = local_168.pos.row_begin._M_current;
  pAVar13 = local_78;
  psVar15 = &local_168;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    psVar15->ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)pAVar13->data_;
    pAVar13 = pAVar13 + (ulong)bVar17 * -2 + 1;
    psVar15 = (sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar15 + ((ulong)bVar17 * -2 + 1) * 8);
  }
  if (((local_168.pos.row_begin._M_current != iVar4._M_current) ||
      (local_168.pos.row_end._M_current != iVar5._M_current)) ||
     ((local_168.pos.row_current._M_current != iVar6._M_current ||
      (iVar6._M_current != iVar5._M_current && local_168.pos.col_current != piVar7)))) {
    do {
      sVar3 = (this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted;
      if (sVar3 == 0) {
        *local_168.pos.col_current =
             -(this->
              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.key_info.delkey;
LAB_009017fd:
        (this->
        super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).
        super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.
        super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.num_deleted = sVar3 + 1;
      }
      else {
        iVar9 = (this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.key_info.delkey;
        iVar10 = *local_168.pos.col_current;
        piVar2 = (int *)((long)&(this->
                                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                ).
                                super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                .ht_.
                                super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                .ht_.key_info.super_TransparentHasher + 8);
        *piVar2 = *piVar2 + 1;
        *local_168.pos.col_current = -iVar9;
        if (iVar10 + iVar9 != 0) goto LAB_009017fd;
      }
      google::
      sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::operator++(&local_168);
    } while (((local_168.pos.row_begin._M_current != iVar4._M_current) ||
             (local_168.pos.row_end._M_current != iVar5._M_current)) ||
            ((local_168.pos.row_current._M_current != iVar6._M_current ||
             (iVar6._M_current != iVar5._M_current && local_168.pos.col_current != piVar7))));
  }
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.
                   super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> + 0x28) =
       true;
  local_78[0].data_._0_4_ = 0;
  local_168.ht = (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)(*(size_type *)
                      ((long)&(this->
                              super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              ).
                              super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.
                              super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              .ht_.table.settings + 0x18) -
                    (this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_120,"0u","this->ht_.size()",(uint *)local_78,
             (unsigned_long *)&local_168);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((pointer)local_120._8_8_ == (pointer)0x0) {
      piVar16 = (pointer)0xaf1463;
    }
    else {
      piVar16 = *(pointer *)local_120._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x415,(char *)piVar16);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_168.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_168.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                             super_TransparentHasher.super_Hasher + 8))();
    }
  }
  uVar8 = local_120._8_8_;
  if ((pointer)local_120._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_120._8_8_ !=
        &(((Settings *)(local_120._8_8_ + 8))->
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_120._8_8_);
    }
    operator_delete((void *)uVar8);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}